

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

HelicsInput
helicsFederateRegisterSubscription(HelicsFederate fed,char *key,char *units,HelicsError *err)

{
  size_t sVar1;
  size_t sVar2;
  Input *pIVar3;
  HelicsInput pvVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  string_view target;
  string_view units_00;
  __single_object sub;
  shared_ptr<helics::ValueFederate> fedObj;
  _Head_base<0UL,_helics::InputObject_*,_false> local_50;
  __uniq_ptr_impl<helics::InputObject,_std::default_delete<helics::InputObject>_> local_48;
  __shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  getValueFedSharedPtr(&local_40,(HelicsError *)fed);
  if (local_40._M_ptr == (ValueFederate *)0x0) {
    pvVar4 = (HelicsInput)0x0;
  }
  else {
    std::make_unique<helics::InputObject>();
    sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (key != (char *)0x0) {
      sVar1 = strlen(key);
      _Var5._M_p = key;
    }
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var6._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (units != (char *)0x0) {
      sVar2 = strlen(units);
      _Var6._M_p = units;
    }
    target._M_str = _Var5._M_p;
    target._M_len = sVar1;
    units_00._M_str = _Var6._M_p;
    units_00._M_len = sVar2;
    pIVar3 = helics::ValueFederate::registerSubscription(local_40._M_ptr,target,units_00);
    (local_50._M_head_impl)->inputPtr = pIVar3;
    std::__shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_50._M_head_impl)->fedptr).
                super___shared_ptr<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    local_48._M_t.
    super__Tuple_impl<0UL,_helics::InputObject_*,_std::default_delete<helics::InputObject>_>.
    super__Head_base<0UL,_helics::InputObject_*,_false>._M_head_impl =
         (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
         (tuple<helics::InputObject_*,_std::default_delete<helics::InputObject>_>)
         local_50._M_head_impl;
    local_50._M_head_impl = (InputObject *)0x0;
    pvVar4 = anon_unknown.dwarf_694c0::addInput
                       (fed,(unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>
                             *)&local_48);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               &local_48);
    std::unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_>::~unique_ptr
              ((unique_ptr<helics::InputObject,_std::default_delete<helics::InputObject>_> *)
               &local_50);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return pvVar4;
}

Assistant:

HelicsInput helicsFederateRegisterSubscription(HelicsFederate fed, const char* key, const char* units, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto sub = std::make_unique<helics::InputObject>();
        sub->inputPtr = &fedObj->registerSubscription(AS_STRING_VIEW(key), AS_STRING_VIEW(units));
        sub->fedptr = std::move(fedObj);
        return addInput(fed, std::move(sub));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
    // LCOV_EXCL_STOP
}